

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

LaneArray<4> * __thiscall
wasm::Literal::getLanesF32x4(LaneArray<4> *__return_storage_ptr__,Literal *this)

{
  Literal *this_00;
  Literal *in_RDX;
  long lVar1;
  Literal local_40;
  
  getLanes<int,4>(__return_storage_ptr__,(wasm *)this,in_RDX);
  for (lVar1 = 0; lVar1 != 0x60; lVar1 = lVar1 + 0x18) {
    this_00 = (Literal *)((long)&__return_storage_ptr__->_M_elems[0].field_0 + lVar1);
    castToF32(&local_40,this_00);
    if (this_00 != &local_40) {
      ~Literal(this_00);
      Literal(this_00,&local_40);
    }
    ~Literal(&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

LaneArray<4> Literal::getLanesF32x4() const {
  auto lanes = getLanesI32x4();
  for (size_t i = 0; i < lanes.size(); ++i) {
    lanes[i] = lanes[i].castToF32();
  }
  return lanes;
}